

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void quantize_fp_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int64_t iVar7;
  byte bVar8;
  tran_low_t *in_RCX;
  tran_low_t *in_RDX;
  tran_low_t *in_RSI;
  long in_RDI;
  long in_R8;
  int16_t *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  long in_stack_00000018;
  tran_low_t abs_dqcoeff;
  int tmp32;
  int64_t abs_coeff;
  int coeff_sign;
  int dequant;
  qm_val_t iwt;
  qm_val_t wt;
  int coeff;
  int rc;
  int rounding [2];
  int eob;
  int i;
  uint local_70;
  uint local_64;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar9;
  int in_stack_ffffffffffffffbc;
  int iVar10;
  undefined4 in_stack_ffffffffffffffcc;
  
  iVar10 = -1;
  bVar8 = (byte)rounding[0];
  iVar2 = (int)(short)*in_RCX + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f);
  iVar3 = (int)*(short *)((long)in_RCX + 2) + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f);
  memset(in_stack_00000008,0,(long)in_RSI << 2);
  memset(in_stack_00000010,0,(long)in_RSI << 2);
  if ((_dequant == 0) && (_coeff == 0)) {
    iVar10 = av1_quantize_fp_no_qmatrix
                       (in_R9,(int16_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar10),
                        (int16_t *)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffbc,
                        (int16_t *)
                        CONCAT17(in_stack_ffffffffffffffb7,
                                 CONCAT16(in_stack_ffffffffffffffb6,
                                          CONCAT24(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0))),
                        in_stack_ffffffffffffffac,in_RCX,in_RDX,in_RSI);
    *_abs_dqcoeff = (short)iVar10;
  }
  else {
    for (iVar2 = 0; (long)iVar2 < (long)in_RSI; iVar2 = iVar2 + 1) {
      iVar3 = (int)*(short *)(abs_coeff + (long)iVar2 * 2);
      uVar1 = *(uint *)(in_RDI + (long)iVar3 * 4);
      if (_dequant == 0) {
        bVar9 = 0x20;
      }
      else {
        bVar9 = *(byte *)(_dequant + iVar3);
      }
      if (_coeff == 0) {
        local_70 = 0x20;
      }
      else {
        local_70 = (uint)*(byte *)(_coeff + iVar3);
      }
      iVar4 = (int)((int)*(short *)(in_stack_00000018 + (long)(int)(uint)(iVar3 != 0) * 2) *
                    local_70 + 0x10) >> 5;
      uVar5 = 0;
      if ((int)uVar1 < 0) {
        uVar5 = 0xffffffff;
      }
      lVar6 = (long)(int)((uVar1 ^ uVar5) - uVar5);
      local_64 = 0;
      if ((long)((int)*(short *)(in_stack_00000018 + (long)(int)(uint)(iVar3 != 0) * 2) <<
                (5 - (bVar8 + 1) & 0x1f)) <= (long)(lVar6 * (ulong)bVar9)) {
        iVar7 = clamp64(*(int *)(&stack0xffffffffffffffc0 + (long)(int)(uint)(iVar3 != 0) * 4) +
                        lVar6,-0x8000,0x7fff);
        local_64 = (uint)((long)(iVar7 * (ulong)bVar9 *
                                (long)*(short *)(in_R8 + (long)(int)(uint)(iVar3 != 0) * 2)) >>
                         (0x15 - bVar8 & 0x3f));
        *(uint *)((long)in_stack_00000008 + (long)iVar3 * 4) = (local_64 ^ uVar5) - uVar5;
        *(uint *)((long)in_stack_00000010 + (long)iVar3 * 4) =
             ((int)(local_64 * iVar4) >> (bVar8 & 0x1f) ^ uVar5) - uVar5;
      }
      if (local_64 != 0) {
        iVar10 = iVar2;
      }
    }
    *_abs_dqcoeff = (short)iVar10 + 1;
  }
  return;
}

Assistant:

static void quantize_fp_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, int log_scale) {
  int i, eob = -1;
  const int rounding[2] = { ROUND_POWER_OF_TWO(round_ptr[0], log_scale),
                            ROUND_POWER_OF_TWO(round_ptr[1], log_scale) };
  // TODO(jingning) Decide the need of these arguments after the
  // quantization process is completed.
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  if (qm_ptr == NULL && iqm_ptr == NULL) {
    *eob_ptr = av1_quantize_fp_no_qmatrix(quant_ptr, dequant_ptr, round_ptr,
                                          log_scale, scan, (int)n_coeffs,
                                          coeff_ptr, qcoeff_ptr, dqcoeff_ptr);
  } else {
    // Quantization pass: All coefficients with index >= zero_flag are
    // skippable. Note: zero_flag can be zero.
    for (i = 0; i < n_coeffs; i++) {
      const int rc = scan[i];
      const int coeff = coeff_ptr[rc];
      const qm_val_t wt = qm_ptr ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const qm_val_t iwt = iqm_ptr ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const int coeff_sign = AOMSIGN(coeff);
      int64_t abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      int tmp32 = 0;
      if (abs_coeff * wt >=
          (dequant_ptr[rc != 0] << (AOM_QM_BITS - (1 + log_scale)))) {
        abs_coeff += rounding[rc != 0];
        abs_coeff = clamp64(abs_coeff, INT16_MIN, INT16_MAX);
        tmp32 = (int)((abs_coeff * wt * quant_ptr[rc != 0]) >>
                      (16 - log_scale + AOM_QM_BITS));
        qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
        const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
        dqcoeff_ptr[rc] = (abs_dqcoeff ^ coeff_sign) - coeff_sign;
      }

      if (tmp32) eob = i;
    }
    *eob_ptr = eob + 1;
  }
}